

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compress_advanced_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_CCtx_params params)

{
  ZSTD_CCtx_params params_00;
  uint uVar1;
  size_t sVar2;
  long lVar3;
  ZSTD_CCtx_params *pZVar4;
  ZSTD_CCtx_params *pZVar5;
  undefined8 *puVar6;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined8 in_stack_fffffffffffffed0;
  undefined1 auVar7 [12];
  undefined1 auVar8 [24];
  undefined1 in_stack_fffffffffffffed8 [112];
  undefined1 auVar9 [24];
  ZSTD_CCtx_params local_b0;
  
  pZVar4 = &params;
  pZVar5 = &local_b0;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = (pZVar4->cParams).windowLog;
    pZVar5->format = pZVar4->format;
    (pZVar5->cParams).windowLog = uVar1;
    pZVar4 = (ZSTD_CCtx_params *)&(pZVar4->cParams).chainLog;
    pZVar5 = (ZSTD_CCtx_params *)&(pZVar5->cParams).chainLog;
  }
  pZVar4 = &params;
  puVar6 = (undefined8 *)&stack0xfffffffffffffec8;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar6 = *(undefined8 *)pZVar4;
    pZVar4 = (ZSTD_CCtx_params *)&(pZVar4->cParams).chainLog;
    puVar6 = puVar6 + 1;
  }
  params_00.cParams.windowLog = in_stack_fffffffffffffecc;
  params_00.format = in_stack_fffffffffffffec8;
  params_00.cParams.chainLog = (int)in_stack_fffffffffffffed0;
  params_00.cParams.hashLog = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  auVar7 = in_stack_fffffffffffffed8._16_12_;
  auVar8 = in_stack_fffffffffffffed8._64_24_;
  auVar9 = in_stack_fffffffffffffed8._88_24_;
  params_00.cParams.searchLog = in_stack_fffffffffffffed8._0_4_;
  params_00.cParams.minMatch = in_stack_fffffffffffffed8._4_4_;
  params_00.cParams.targetLength = in_stack_fffffffffffffed8._8_4_;
  params_00.cParams.strategy = in_stack_fffffffffffffed8._12_4_;
  params_00.fParams.contentSizeFlag = auVar7._0_4_;
  params_00.fParams.checksumFlag = auVar7._4_4_;
  params_00.fParams.noDictIDFlag = auVar7._8_4_;
  params_00.compressionLevel = in_stack_fffffffffffffed8._28_4_;
  params_00.forceWindow = in_stack_fffffffffffffed8._32_4_;
  params_00.attachDictPref = in_stack_fffffffffffffed8._36_4_;
  params_00.nbWorkers = in_stack_fffffffffffffed8._40_4_;
  params_00._60_4_ = in_stack_fffffffffffffed8._44_4_;
  params_00.jobSize = in_stack_fffffffffffffed8._48_8_;
  params_00.overlapLog = in_stack_fffffffffffffed8._56_4_;
  params_00.rsyncable = in_stack_fffffffffffffed8._60_4_;
  params_00.ldmParams.enableLdm = auVar8._0_4_;
  params_00.ldmParams.hashLog = auVar8._4_4_;
  params_00.ldmParams.bucketSizeLog = auVar8._8_4_;
  params_00.ldmParams.minMatchLength = auVar8._12_4_;
  params_00.ldmParams.hashRateLog = auVar8._16_4_;
  params_00.ldmParams.windowLog = auVar8._20_4_;
  params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar9._0_8_;
  params_00.customMem.customFree = (ZSTD_freeFunction)auVar9._8_8_;
  params_00.customMem.opaque = (void *)auVar9._16_8_;
  sVar2 = ZSTD_resetCCtx_internal(cctx,params_00,srcSize,ZSTDcrp_continue,ZSTDb_not_buffered);
  if (sVar2 < 0xffffffffffffff89) {
    sVar2 = ZSTD_compress_insertDictionary
                      ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&local_b0,dict,
                       dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,cctx->entropyWorkspace);
    if (sVar2 < 0xffffffffffffff89) {
      cctx->dictID = (U32)sVar2;
      sVar2 = ZSTD_compressEnd(cctx,dst,dstCapacity,src,srcSize);
      return sVar2;
    }
  }
  return sVar2;
}

Assistant:

size_t ZSTD_compress_advanced_internal(
        ZSTD_CCtx* cctx,
        void* dst, size_t dstCapacity,
        const void* src, size_t srcSize,
        const void* dict,size_t dictSize,
        ZSTD_CCtx_params params)
{
    DEBUGLOG(4, "ZSTD_compress_advanced_internal (srcSize:%u)", (unsigned)srcSize);
    CHECK_F( ZSTD_compressBegin_internal(cctx,
                         dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast, NULL,
                         params, srcSize, ZSTDb_not_buffered) );
    return ZSTD_compressEnd(cctx, dst, dstCapacity, src, srcSize);
}